

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O0

void __thiscall InstructionGenerator::genConsoleOut(InstructionGenerator *this,uint argCount)

{
  Variable local_50;
  uint local_1c;
  Instruction local_18;
  uint a;
  InstructionGenerator *pIStack_10;
  uint argCount_local;
  InstructionGenerator *this_local;
  
  local_18 = CONSOLE_OUT;
  a = argCount;
  pIStack_10 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<Instruction>
            (this->bytecode,&local_18);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode,&a);
  for (local_1c = 0; local_1c < a; local_1c = local_1c + 1) {
    VirtualStack::pop(&local_50,&this->super_VirtualStack);
    Variable::~Variable(&local_50);
  }
  return;
}

Assistant:

void InstructionGenerator::genConsoleOut(unsigned int argCount)
{
    bytecode->emplace_back(Instruction::CONSOLE_OUT);
    bytecode->emplace_back(argCount);
    for(unsigned int a = 0; a < argCount; a++)
        pop();
}